

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_cgraph * ggml_build_forward(ggml_tensor *tensor)

{
  ggml_tensor *in_RSI;
  ggml_cgraph *in_RDI;
  ggml_cgraph *result;
  
  memset(in_RDI,0,0x18038);
  ggml_build_forward_impl(result,in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  return in_RDI;
}

Assistant:

struct ggml_cgraph ggml_build_forward(struct ggml_tensor * tensor) {
    struct ggml_cgraph result = {
        /*.n_nodes      =*/ 0,
        /*.n_leafs      =*/ 0,
        /*.n_threads    =*/ 0,
        /*.work_size    =*/ 0,
        /*.work         =*/ NULL,
        /*.nodes        =*/ { NULL },
        /*.grads        =*/ { NULL },
        /*.leafs        =*/ { NULL },
        /*.perf_runs    =*/ 0,
        /*.perf_cycles  =*/ 0,
        /*.perf_time_us =*/ 0,
    };

    ggml_build_forward_impl(&result, tensor, false);

    return result;
}